

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

int __thiscall QDirListingPrivate::init(QDirListingPrivate *this,EVP_PKEY_CTX *ctx)

{
  QLatin1StringView str;
  QStringView pattern;
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QString *filter;
  QStringList *__range1;
  CaseSensitivity cs;
  bool isCase;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffff28;
  WildcardConversionOption in_stack_ffffffffffffff2c;
  Filter in_stack_ffffffffffffff30;
  CaseSensitivity in_stack_ffffffffffffff34;
  QListSpecialMethods<QString> *in_stack_ffffffffffffff38;
  QFlagsStorage<QDir::Filter> lhs;
  QStringView *in_stack_ffffffffffffff40;
  QList<QRegularExpression> *this_00;
  QStringList *pQVar3;
  QFileSystemMetaData *in_stack_ffffffffffffff68;
  QFileSystemEntry *in_stack_ffffffffffffff70;
  QList<QRegularExpression> *in_stack_ffffffffffffff78;
  undefined3 in_stack_ffffffffffffff9c;
  QFlagsStorage<QRegularExpression::WildcardConversionOption> options;
  QDirListingPrivate *pQVar4;
  storage_type_conflict *in_stack_ffffffffffffffa8;
  qsizetype in_stack_ffffffffffffffb8;
  QStringView local_38;
  iterator local_28;
  iterator local_20;
  QDirListingPrivate *local_18;
  Int local_10;
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  options.i = CONCAT13((char)ctx,in_stack_ffffffffffffff9c) & 0x1ffffff;
  pQVar3 = &this->nameFilters;
  pQVar4 = this;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_ffffffffffffff38,
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  str.m_data._0_4_ = (int)pQVar3;
  str.m_size = (qsizetype)this;
  str.m_data._4_4_ = (int)((ulong)pQVar3 >> 0x20);
  bVar1 = QListSpecialMethods<QString>::contains
                    (in_stack_ffffffffffffff38,str,in_stack_ffffffffffffff34);
  lhs.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (bVar1) {
    QList<QString>::clear
              ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  if ((this->useLegacyFilters & 1U) != 0) {
    local_c = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
              super_QFlagsStorage<QDir::Filter>.i;
    bVar1 = ::operator==((QFlags<QDir::Filter>)lhs.i,in_stack_ffffffffffffff30);
    if (bVar1) {
      QFlags<QDir::Filter>::QFlags
                ((QFlags<QDir::Filter> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c);
      (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
      super_QFlagsStorage<QDir::Filter>.i = local_10;
    }
  }
  this_00 = &this->nameRegExps;
  QList<QString>::size(&this->nameFilters);
  QList<QRegularExpression>::reserve(in_stack_ffffffffffffff78,in_stack_ffffffffffffffb8);
  local_18 = this;
  bVar1 = init::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this_00);
  local_20.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QList<QString>::begin
                       ((QList<QString> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QString>::end((QList<QString> *)
                                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  while( true ) {
    local_38.m_data = (storage_type_conflict *)local_28.i;
    bVar2 = QList<QString>::iterator::operator!=(&local_20,local_28);
    if (!bVar2) break;
    in_stack_ffffffffffffff70 = (QFileSystemEntry *)QList<QString>::iterator::operator*(&local_20);
    QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff40,(QString *)&this->nameRegExps)
    ;
    in_stack_ffffffffffffff34 = (uint)bVar1;
    QFlags<QRegularExpression::WildcardConversionOption>::QFlags
              ((QFlags<QRegularExpression::WildcardConversionOption> *)
               (ulong)CONCAT14(bVar1,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c);
    in_stack_ffffffffffffff40 = &local_38;
    pattern.m_data = in_stack_ffffffffffffffa8;
    pattern.m_size = (qsizetype)pQVar4;
    QRegularExpression::fromWildcard
              (pattern,(CaseSensitivity)((ulong)pQVar3 >> 0x20),(WildcardConversionOptions)options.i
              );
    QList<QRegularExpression>::emplace_back<QRegularExpression>
              ((QList<QRegularExpression> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (QRegularExpression *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x293cb5);
    QList<QString>::iterator::operator++(&local_20);
  }
  if ((options.i & 0x1000000) != 0) {
    QFileSystemEngine::createLegacyEngine(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator=
              ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::~unique_ptr
              ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
               in_stack_ffffffffffffff40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::init(bool resolveEngine = true)
{
    if (nameFilters.contains("*"_L1))
        nameFilters.clear();

    if (useLegacyFilters) {
        if (legacyDirFilters == QDir::NoFilter)
            legacyDirFilters = QDir::AllEntries;
    }

#if QT_CONFIG(regularexpression)
    nameRegExps.reserve(nameFilters.size());

    const bool isCase = [this] {
        if (useLegacyFilters)
            return legacyDirFilters.testAnyFlags(QDir::CaseSensitive);
        return iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::CaseSensitive);
    }();

    const auto cs = isCase ? Qt::CaseSensitive : Qt::CaseInsensitive;
    for (const auto &filter : nameFilters)
        nameRegExps.emplace_back(QRegularExpression::fromWildcard(filter, cs));
#endif

    if (resolveEngine) {
        engine = QFileSystemEngine::createLegacyEngine(initialEntryInfo.entry,
                                                       initialEntryInfo.metaData);
    }
}